

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
inja::ForObjectStatementNode::ForObjectStatementNode
          (ForObjectStatementNode *this,string *key,string *value,BlockNode *parent,size_t pos)

{
  size_t pos_local;
  BlockNode *parent_local;
  string *value_local;
  string *key_local;
  ForObjectStatementNode *this_local;
  
  ForStatementNode::ForStatementNode(&this->super_ForStatementNode,parent,pos);
  (this->super_ForStatementNode).super_StatementNode.super_AstNode._vptr_AstNode =
       (_func_int **)&PTR_accept_0024d7c8;
  ::std::__cxx11::string::string((string *)&this->key,(string *)key);
  ::std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

explicit ForObjectStatementNode(const std::string& key, const std::string& value, BlockNode* const parent, size_t pos)
      : ForStatementNode(parent, pos), key(key), value(value) {}